

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O1

ngx_int_t ngx_parse_url(ngx_pool_t *pool,ngx_url_t *u)

{
  uchar *addr;
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ushort uVar8;
  in_addr_t iVar9;
  ngx_int_t nVar10;
  u_char *puVar11;
  size_t sVar12;
  u_char *puVar13;
  u_char *puVar14;
  char *pcVar15;
  ngx_addr_t *pnVar16;
  sockaddr *psVar17;
  long lVar18;
  u_char *puVar19;
  u_char *puVar20;
  size_t sVar21;
  in6_addr *__a;
  u_char *puVar22;
  uint uVar23;
  
  uVar4 = (u->url).len;
  puVar13 = (u->url).data;
  if ((4 < uVar4) && (nVar10 = ngx_strncasecmp(puVar13,(u_char *)"unix:",5), nVar10 == 0)) {
    sVar12 = (u->url).len;
    puVar14 = (u->url).data;
    puVar13 = puVar14 + 5;
    sVar21 = sVar12 - 5;
    if ((u->field_0x48 & 2) != 0) {
      puVar14 = puVar14 + sVar12;
      if (puVar13 < puVar14) {
        lVar18 = sVar12 - 5;
        puVar20 = puVar13;
        do {
          if (*puVar20 == ':') goto LAB_001199e9;
          puVar20 = puVar20 + 1;
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
      }
      puVar20 = (u_char *)0x0;
LAB_001199e9:
      if (puVar20 != (u_char *)0x0) {
        sVar21 = (long)puVar20 - (long)puVar13;
        (u->uri).len = (long)puVar14 - (long)(puVar20 + 1);
        (u->uri).data = puVar20 + 1;
      }
    }
    if (sVar21 == 0) {
      pcVar15 = "no path in the unix domain socket";
    }
    else {
      uVar4 = sVar21 + 1;
      (u->host).len = sVar21;
      (u->host).data = puVar13;
      if (uVar4 < 0x6d) {
        u->socklen = 0x6e;
        (u->sockaddr).sockaddr.sa_family = 1;
        ngx_cpystrn((u_char *)&(u->sockaddr).sockaddr_in.sin_port,puVar13,uVar4);
        pnVar16 = (ngx_addr_t *)ngx_pcalloc(pool,0x20);
        u->addrs = pnVar16;
        if (pnVar16 == (ngx_addr_t *)0x0) {
          return -1;
        }
        psVar17 = (sockaddr *)ngx_pcalloc(pool,0x6e);
        if (psVar17 != (sockaddr *)0x0) {
          u->family = 1;
          u->naddrs = 1;
          psVar17->sa_family = 1;
          ngx_cpystrn((u_char *)psVar17->sa_data,puVar13,uVar4);
          pnVar16 = u->addrs;
          pnVar16->sockaddr = psVar17;
          pnVar16->socklen = 0x6e;
          (pnVar16->name).len = sVar21 + 5;
          (pnVar16->name).data = (u->url).data;
          return 0;
        }
        return -1;
      }
      pcVar15 = "too long path in the unix domain socket";
    }
    goto LAB_00119d35;
  }
  if ((uVar4 == 0) || (*puVar13 != '[')) {
    u->socklen = 0x10;
    (u->sockaddr).sockaddr.sa_family = 2;
    u->family = 2;
    sVar21 = (u->url).len;
    puVar13 = (u->url).data;
    sVar12 = sVar21;
    puVar14 = puVar13;
    if (0 < (long)sVar21) {
      do {
        if (*puVar14 == ':') goto LAB_001198ff;
        sVar12 = sVar12 - 1;
        puVar14 = puVar14 + 1;
      } while (sVar12 != 0);
    }
    puVar14 = (u_char *)0x0;
LAB_001198ff:
    puVar20 = puVar13;
    sVar12 = sVar21;
    if (0 < (long)sVar21) {
      do {
        if (*puVar20 == '/') goto LAB_00119919;
        sVar12 = sVar12 - 1;
        puVar20 = puVar20 + 1;
      } while (sVar12 != 0);
    }
    puVar20 = (u_char *)0x0;
LAB_00119919:
    sVar12 = sVar21;
    puVar19 = puVar13;
    if (0 < (long)sVar21) {
      do {
        if (*puVar19 == '?') goto LAB_00119933;
        sVar12 = sVar12 - 1;
        puVar19 = puVar19 + 1;
      } while (sVar12 != 0);
    }
    puVar19 = (u_char *)0x0;
LAB_00119933:
    puVar22 = puVar20;
    if (puVar19 < puVar20) {
      puVar22 = puVar19;
    }
    if (puVar20 == (u_char *)0x0) {
      puVar22 = puVar19;
    }
    if (puVar19 == (u_char *)0x0) {
      puVar22 = puVar20;
    }
    puVar20 = puVar13 + sVar21;
    if (puVar22 != (u_char *)0x0) {
      if ((u->field_0x48 & 3) != 2) goto LAB_00119c2b;
      (u->uri).len = (long)(puVar13 + sVar21) - (long)puVar22;
      (u->uri).data = puVar22;
      puVar20 = puVar22;
      if (puVar22 < puVar14) {
        puVar14 = (u_char *)0x0;
      }
    }
    if (puVar14 == (u_char *)0x0) {
      if ((puVar22 == (u_char *)0x0) && ((u->field_0x48 & 1) != 0)) {
        nVar10 = ngx_atoi(puVar13,(long)puVar20 - (long)puVar13);
        if (nVar10 != -1) {
          if (0xffffffffffff0000 < nVar10 - 0x10000U) {
            uVar8 = (ushort)nVar10;
            u->port = uVar8;
            (u->sockaddr).sockaddr_in.sin_port = uVar8 << 8 | uVar8 >> 8;
            (u->port_text).len = (long)puVar20 - (long)puVar13;
            (u->port_text).data = puVar13;
            goto LAB_00119a7a;
          }
          goto LAB_001199aa;
        }
      }
      u->field_0x48 = u->field_0x48 | 8;
      uVar8 = u->default_port;
      u->port = uVar8;
      (u->sockaddr).sockaddr_in.sin_port = uVar8 << 8 | uVar8 >> 8;
    }
    else {
      puVar19 = puVar14 + 1;
      nVar10 = ngx_atoi(puVar19,(long)puVar20 - (long)puVar19);
      if (nVar10 - 0x10000U < 0xffffffffffff0001) {
LAB_001199aa:
        pcVar15 = "invalid port";
        goto LAB_00119d35;
      }
      uVar8 = (ushort)nVar10;
      u->port = uVar8;
      (u->sockaddr).sockaddr_in.sin_port = uVar8 << 8 | uVar8 >> 8;
      (u->port_text).len = (long)puVar20 - (long)puVar19;
      (u->port_text).data = puVar19;
      puVar20 = puVar14;
    }
    sVar21 = (long)puVar20 - (long)puVar13;
    if (sVar21 != 0) {
      (u->host).len = sVar21;
      (u->host).data = puVar13;
      bVar1 = u->field_0x48;
      if ((sVar21 == 1 && (bVar1 & 1) != 0) && (*puVar13 == '*')) {
        (u->sockaddr).sockaddr_in6.sin6_flowinfo = 0;
        u->field_0x48 = bVar1 | 0x10;
        return 0;
      }
      iVar9 = ngx_inet_addr(puVar13,sVar21);
      (u->sockaddr).sockaddr_in6.sin6_flowinfo = iVar9;
      if (iVar9 == 0xffffffff) {
        if ((bVar1 & 4) != 0) {
          return 0;
        }
        nVar10 = ngx_inet_resolve_host(pool,u);
        if (nVar10 != 0) {
          return -1;
        }
        psVar17 = u->addrs->sockaddr;
        uVar23 = (uint)psVar17->sa_family;
        u->family = uVar23;
        uVar2 = u->addrs->socklen;
        u->socklen = uVar2;
        memcpy(&u->sockaddr,psVar17,(ulong)uVar2);
        if (uVar23 == 10) {
          if (*(int *)((long)&u->sockaddr + 8) != 0) {
            return 0;
          }
          if (*(int *)((long)&u->sockaddr + 0xc) != 0) {
            return 0;
          }
          if (*(int *)((long)&u->sockaddr + 0x10) != 0) {
            return 0;
          }
          uVar3 = *(uint32_t *)((long)&u->sockaddr + 0x14);
        }
        else {
          uVar3 = (u->sockaddr).sockaddr_in6.sin6_flowinfo;
        }
        if (uVar3 != 0) {
          return 0;
        }
LAB_00119a7a:
        u->field_0x48 = u->field_0x48 | 0x10;
        return 0;
      }
      if (iVar9 == 0) {
        u->field_0x48 = bVar1 | 0x10;
      }
      u->naddrs = 1;
      pnVar16 = (ngx_addr_t *)ngx_pcalloc(pool,0x20);
      u->addrs = pnVar16;
      if (pnVar16 == (ngx_addr_t *)0x0) {
        return -1;
      }
      psVar17 = (sockaddr *)ngx_pcalloc(pool,0x10);
      if (psVar17 == (sockaddr *)0x0) {
        return -1;
      }
      uVar5 = *(undefined8 *)&u->sockaddr;
      uVar6 = *(undefined8 *)((long)&u->sockaddr + 8);
      psVar17->sa_family = (short)uVar5;
      psVar17->sa_data[0] = (char)((ulong)uVar5 >> 0x10);
      psVar17->sa_data[1] = (char)((ulong)uVar5 >> 0x18);
      psVar17->sa_data[2] = (char)((ulong)uVar5 >> 0x20);
      psVar17->sa_data[3] = (char)((ulong)uVar5 >> 0x28);
      psVar17->sa_data[4] = (char)((ulong)uVar5 >> 0x30);
      psVar17->sa_data[5] = (char)((ulong)uVar5 >> 0x38);
      *(undefined8 *)(psVar17->sa_data + 6) = uVar6;
      pnVar16 = u->addrs;
      pnVar16->sockaddr = psVar17;
      pnVar16->socklen = 0x10;
      goto LAB_00119b7a;
    }
  }
  else {
    u->socklen = 0x1c;
    (u->sockaddr).sockaddr.sa_family = 10;
    sVar21 = (u->url).len;
    puVar14 = (u->url).data;
    puVar13 = puVar14 + 1;
    if (1 < (long)sVar21) {
      lVar18 = sVar21 - 1;
      puVar20 = puVar13;
      do {
        if (*puVar20 == ']') goto LAB_00119871;
        puVar20 = puVar20 + 1;
        lVar18 = lVar18 + -1;
      } while (lVar18 != 0);
    }
    puVar20 = (u_char *)0x0;
LAB_00119871:
    if (puVar20 == (u_char *)0x0) {
LAB_00119c2b:
      pcVar15 = "invalid host";
      goto LAB_00119d35;
    }
    puVar11 = puVar14 + sVar21;
    puVar19 = puVar20 + 1;
    puVar22 = puVar19;
    if (puVar19 < puVar11) {
      do {
        if (*puVar22 == '/') goto LAB_001198a0;
        puVar22 = puVar22 + 1;
      } while (puVar22 != puVar11);
    }
    puVar22 = (u_char *)0x0;
LAB_001198a0:
    if (puVar22 != (u_char *)0x0) {
      if ((u->field_0x48 & 3) != 2) goto LAB_00119c2b;
      (u->uri).len = (long)puVar11 - (long)puVar22;
      (u->uri).data = puVar22;
      puVar11 = puVar22;
    }
    if (puVar19 < puVar11) {
      if (*puVar19 != ':') goto LAB_00119c2b;
      puVar19 = puVar20 + 2;
      nVar10 = ngx_atoi(puVar19,(long)puVar11 - (long)puVar19);
      if (nVar10 - 0x10000U < 0xffffffffffff0001) goto LAB_001199aa;
      uVar8 = (ushort)nVar10;
      u->port = uVar8;
      (u->sockaddr).sockaddr_in.sin_port = uVar8 << 8 | uVar8 >> 8;
      (u->port_text).len = (long)puVar11 - (long)puVar19;
      (u->port_text).data = puVar19;
    }
    else {
      u->field_0x48 = u->field_0x48 | 8;
      uVar8 = u->default_port;
      u->port = uVar8;
      (u->sockaddr).sockaddr_in.sin_port = uVar8 << 8 | uVar8 >> 8;
    }
    sVar21 = (long)puVar20 - (long)puVar13;
    if (sVar21 != 0) {
      (u->host).len = sVar21 + 2;
      (u->host).data = puVar14;
      addr = (u->sockaddr).sockaddr_in.sin_zero;
      nVar10 = ngx_inet6_addr(puVar13,sVar21,addr);
      if (nVar10 == 0) {
        if ((((*(int *)addr == 0) && (*(int *)((long)&u->sockaddr + 0xc) == 0)) &&
            (*(int *)((long)&u->sockaddr + 0x10) == 0)) &&
           (*(int *)((long)&u->sockaddr + 0x14) == 0)) {
          u->field_0x48 = u->field_0x48 | 0x10;
        }
        u->family = 10;
        u->naddrs = 1;
        pnVar16 = (ngx_addr_t *)ngx_pcalloc(pool,0x20);
        u->addrs = pnVar16;
        if (pnVar16 == (ngx_addr_t *)0x0) {
          return -1;
        }
        psVar17 = (sockaddr *)ngx_pcalloc(pool,0x1c);
        if (psVar17 == (sockaddr *)0x0) {
          return -1;
        }
        uVar5 = *(undefined8 *)&u->sockaddr;
        uVar6 = *(undefined8 *)((long)&u->sockaddr + 8);
        uVar7 = *(undefined8 *)((long)&u->sockaddr + 0x14);
        *(undefined8 *)(psVar17->sa_data + 10) = *(undefined8 *)((long)&u->sockaddr + 0xc);
        *(undefined8 *)(psVar17[1].sa_data + 2) = uVar7;
        psVar17->sa_family = (short)uVar5;
        psVar17->sa_data[0] = (char)((ulong)uVar5 >> 0x10);
        psVar17->sa_data[1] = (char)((ulong)uVar5 >> 0x18);
        psVar17->sa_data[2] = (char)((ulong)uVar5 >> 0x20);
        psVar17->sa_data[3] = (char)((ulong)uVar5 >> 0x28);
        psVar17->sa_data[4] = (char)((ulong)uVar5 >> 0x30);
        psVar17->sa_data[5] = (char)((ulong)uVar5 >> 0x38);
        *(undefined8 *)(psVar17->sa_data + 6) = uVar6;
        pnVar16 = u->addrs;
        pnVar16->sockaddr = psVar17;
        pnVar16->socklen = 0x1c;
LAB_00119b7a:
        puVar13 = (u_char *)ngx_pnalloc(pool,(u->host).len + 6);
        if (puVar13 != (u_char *)0x0) {
          puVar14 = ngx_sprintf(puVar13,"%V:%d",&u->host,(ulong)u->port);
          pnVar16 = u->addrs;
          (pnVar16->name).len = (long)puVar14 - (long)puVar13;
          (pnVar16->name).data = puVar13;
          return 0;
        }
        return -1;
      }
      pcVar15 = "invalid IPv6 address";
      goto LAB_00119d35;
    }
  }
  pcVar15 = "no host";
LAB_00119d35:
  u->err = pcVar15;
  return -1;
}

Assistant:

ngx_int_t
ngx_parse_url(ngx_pool_t *pool, ngx_url_t *u)
{
    u_char  *p;
    size_t   len;

    p = u->url.data;
    len = u->url.len;

    if (len >= 5 && ngx_strncasecmp(p, (u_char *) "unix:", 5) == 0) {
        return ngx_parse_unix_domain_url(pool, u);
    }

    if (len && p[0] == '[') {
        return ngx_parse_inet6_url(pool, u);
    }

    return ngx_parse_inet_url(pool, u);
}